

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

Inet_addr * __thiscall iqnet::Socket::get_addr(Inet_addr *__return_storage_ptr__,Socket *this)

{
  int iVar1;
  network_error *this_00;
  allocator<char> local_51;
  string local_50;
  socklen_t local_2c;
  undefined1 local_28 [4];
  socklen_t saddr_len;
  sockaddr_in saddr;
  Socket *this_local;
  
  local_2c = 0x10;
  saddr.sin_zero = (uchar  [8])this;
  iVar1 = getsockname(this->sock,(sockaddr *)local_28,&local_2c);
  if (iVar1 == -1) {
    this_00 = (network_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Socket::get_addr",&local_51);
    network_error::network_error(this_00,&local_50,true,0);
    __cxa_throw(this_00,&network_error::typeinfo,network_error::~network_error);
  }
  Inet_addr::Inet_addr(__return_storage_ptr__,(SystemSockAddrIn *)local_28);
  return __return_storage_ptr__;
}

Assistant:

Inet_addr Socket::get_addr() const
{
  sockaddr_in saddr;
  socklen_t saddr_len = sizeof(saddr);

  if (::getsockname(sock, reinterpret_cast<sockaddr*>(&saddr), &saddr_len) == -1)
    throw network_error( "Socket::get_addr" );

  return Inet_addr(reinterpret_cast<const sockaddr_in&>(saddr));
}